

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::set_value(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,string_t *v)

{
  ulong uVar1;
  exception_t<cfgfile::string_trait_t> *this_00;
  string *in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  string *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  allocator *paVar2;
  allocator *__lhs;
  allocator local_191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  allocator local_149;
  string local_148 [119];
  allocator local_d1;
  string local_d0 [192];
  string *local_10;
  
  local_10 = in_RSI;
  if ((*(long *)&in_RDI[1].field_0x20 != 0) &&
     (uVar1 = (**(code **)(**(long **)&in_RDI[1].field_0x20 + 0x10))
                        (*(long **)&in_RDI[1].field_0x20,in_RSI), (uVar1 & 1) == 0)) {
    this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Invalid value: \"",&local_d1);
    string_trait_t::from_ascii(in_stack_fffffffffffffe38);
    format_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
    ::to_string(in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    __lhs = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"\". Value must match to the constraint in tag \"",__lhs)
    ;
    string_trait_t::from_ascii(in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   in_stack_fffffffffffffe40);
    paVar2 = &local_191;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe70,"\".",paVar2);
    string_trait_t::from_ascii(in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,(string_t *)__lhs);
    __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 1),local_10);
  tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
  return;
}

Assistant:

void
	set_value( const typename Trait::string_t & v )
	{
		if( m_constraint )
		{
			if( !m_constraint->check( v ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					format_t< typename Trait::string_t, Trait >::to_string( v ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\"." ) );
		}

		m_value = v;

		this->set_defined();
	}